

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::anon_unknown_15::fulltext_log_assert_to_stream(ostream *s,AssertData *rb)

{
  byte bVar1;
  Enum EVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  StringContains *pSVar6;
  
  EVar2 = rb->m_at;
  if ((EVar2 & (is_throws_with|is_throws_as)) == 0) {
    Color::operator<<(s,Cyan);
    pcVar3 = assertString(rb->m_at);
    poVar4 = std::operator<<(s,pcVar3);
    poVar4 = std::operator<<(poVar4,"( ");
    poVar4 = std::operator<<(poVar4,rb->m_expr);
    poVar4 = std::operator<<(poVar4," ) ");
    Color::operator<<(poVar4,None);
    EVar2 = rb->m_at;
  }
  if ((EVar2 & is_throws) == 0) {
    if ((~EVar2 & 0x60) == 0) {
      Color::operator<<(s,Cyan);
      pcVar3 = assertString(rb->m_at);
      poVar4 = std::operator<<(s,pcVar3);
      poVar4 = std::operator<<(poVar4,"( ");
      poVar4 = std::operator<<(poVar4,rb->m_expr);
      poVar4 = std::operator<<(poVar4,", \"");
      if ((rb->m_exception_string).content.string.field_0.buf[0x17] < '\0') {
        pSVar6 = (StringContains *)(rb->m_exception_string).content.string.field_0.data.ptr;
      }
      else {
        pSVar6 = &rb->m_exception_string;
      }
      poVar4 = std::operator<<(poVar4,(char *)pSVar6);
      poVar4 = std::operator<<(poVar4,"\", ");
      poVar4 = std::operator<<(poVar4,rb->m_exception_type);
      poVar4 = std::operator<<(poVar4," ) ");
      Color::operator<<(poVar4,None);
      if (rb->m_threw == true) {
        if (rb->m_failed == false) {
          pcVar3 = "threw as expected!\n";
        }
        else {
          poVar4 = std::operator<<(s,"threw a DIFFERENT exception! (contents: ");
          s = doctest::operator<<(poVar4,&rb->m_exception);
          pcVar3 = ")\n";
        }
      }
      else {
        pcVar3 = "did NOT throw at all!\n";
      }
      goto LAB_0011088a;
    }
    if ((EVar2 & is_throws_as) == 0) {
      if ((EVar2 & is_throws_with) != 0) {
        Color::operator<<(s,Cyan);
        pcVar3 = assertString(rb->m_at);
        poVar4 = std::operator<<(s,pcVar3);
        poVar4 = std::operator<<(poVar4,"( ");
        poVar4 = std::operator<<(poVar4,rb->m_expr);
        poVar4 = std::operator<<(poVar4,", \"");
        if ((rb->m_exception_string).content.string.field_0.buf[0x17] < '\0') {
          pSVar6 = (StringContains *)(rb->m_exception_string).content.string.field_0.data.ptr;
        }
        else {
          pSVar6 = &rb->m_exception_string;
        }
        poVar4 = std::operator<<(poVar4,(char *)pSVar6);
        poVar4 = std::operator<<(poVar4,"\" ) ");
        Color::operator<<(poVar4,None);
        pcVar5 = "threw a DIFFERENT exception: ";
        bVar1 = rb->m_failed;
        pcVar3 = "threw as expected!";
        goto LAB_00110849;
      }
      if ((char)EVar2 < '\0') {
        pcVar3 = "didn\'t throw!";
        if (rb->m_threw != false) {
          pcVar3 = "THREW exception: ";
        }
        s = std::operator<<(s,pcVar3);
        goto LAB_0011086c;
      }
      pcVar3 = "is correct!\n";
      if ((rb->m_failed & 1U) != 0) {
        pcVar3 = "is NOT correct!\n";
      }
      pcVar5 = "THREW exception: ";
      if (rb->m_threw == false) {
        pcVar5 = pcVar3;
      }
      std::operator<<(s,pcVar5);
      if (rb->m_threw != true) {
        poVar4 = std::operator<<(s,"  values: ");
        pcVar3 = assertString(rb->m_at);
        poVar4 = std::operator<<(poVar4,pcVar3);
        poVar4 = std::operator<<(poVar4,"( ");
        s = doctest::operator<<(poVar4,&rb->m_decomp);
        pcVar3 = " )\n";
        goto LAB_0011088a;
      }
    }
    else {
      Color::operator<<(s,Cyan);
      pcVar3 = assertString(rb->m_at);
      poVar4 = std::operator<<(s,pcVar3);
      poVar4 = std::operator<<(poVar4,"( ");
      poVar4 = std::operator<<(poVar4,rb->m_expr);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,rb->m_exception_type);
      poVar4 = std::operator<<(poVar4," ) ");
      Color::operator<<(poVar4,None);
      pcVar5 = "threw as expected!";
      bVar1 = rb->m_threw_as;
      pcVar3 = "threw a DIFFERENT exception: ";
LAB_00110849:
      if ((bVar1 & 1) != 0) {
        pcVar3 = pcVar5;
      }
      pcVar5 = "did NOT throw at all!";
      if (rb->m_threw != false) {
        pcVar5 = pcVar3;
      }
      s = std::operator<<(poVar4,pcVar5);
LAB_0011086c:
      Color::operator<<(s,Cyan);
    }
    s = doctest::operator<<(s,&rb->m_exception);
  }
  else {
    pcVar3 = "did NOT throw at all!";
    if (rb->m_threw != false) {
      pcVar3 = "threw as expected!";
    }
    s = std::operator<<(s,pcVar3);
  }
  pcVar3 = "\n";
LAB_0011088a:
  std::operator<<(s,pcVar3);
  return;
}

Assistant:

void fulltext_log_assert_to_stream(std::ostream& s, const AssertData& rb) {
        if((rb.m_at & (assertType::is_throws_as | assertType::is_throws_with)) ==
            0) //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << " ) "
                << Color::None;

        if(rb.m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            s << (rb.m_threw ? "threw as expected!" : "did NOT throw at all!") << "\n";
        } else if((rb.m_at & assertType::is_throws_as) &&
                    (rb.m_at & assertType::is_throws_with)) { //!OCLINT
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", \""
                << rb.m_exception_string.c_str()
                << "\", " << rb.m_exception_type << " ) " << Color::None;
            if(rb.m_threw) {
                if(!rb.m_failed) {
                    s << "threw as expected!\n";
                } else {
                    s << "threw a DIFFERENT exception! (contents: " << rb.m_exception << ")\n";
                }
            } else {
                s << "did NOT throw at all!\n";
            }
        } else if(rb.m_at &
                    assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", "
                << rb.m_exception_type << " ) " << Color::None
                << (rb.m_threw ? (rb.m_threw_as ? "threw as expected!" :
                                                "threw a DIFFERENT exception: ") :
                                "did NOT throw at all!")
                << Color::Cyan << rb.m_exception << "\n";
        } else if(rb.m_at &
                    assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", \""
                << rb.m_exception_string.c_str()
                << "\" ) " << Color::None
                << (rb.m_threw ? (!rb.m_failed ? "threw as expected!" :
                                                "threw a DIFFERENT exception: ") :
                                "did NOT throw at all!")
                << Color::Cyan << rb.m_exception << "\n";
        } else if(rb.m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            s << (rb.m_threw ? "THREW exception: " : "didn't throw!") << Color::Cyan
                << rb.m_exception << "\n";
        } else {
            s << (rb.m_threw ? "THREW exception: " :
                                (!rb.m_failed ? "is correct!\n" : "is NOT correct!\n"));
            if(rb.m_threw)
                s << rb.m_exception << "\n";
            else
                s << "  values: " << assertString(rb.m_at) << "( " << rb.m_decomp << " )\n";
        }
    }